

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapType
          (Maybe<capnp::Type> *__return_storage_ptr__,Node *this,Reader type,Schema scope)

{
  uint uVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  ErrorReporter *pEVar3;
  Node *params_1;
  Type *func;
  String local_340;
  ArrayPtr<const_char> local_328 [2];
  Maybe<capnp::Type> *local_308;
  Node *local_300;
  Reader *local_2f8;
  Node **local_2f0;
  Maybe<kj::Exception> local_2e8;
  undefined1 local_188 [8];
  NullableValue<kj::Exception> exception;
  Node *this_local;
  Schema scope_local;
  Maybe<capnp::Type> *result;
  
  exception.field_1.field1[0x157] = 0;
  this_local = (Node *)scope.raw;
  scope_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  kj::Maybe<capnp::Type>::Maybe(__return_storage_ptr__);
  local_2f0 = &this_local;
  params_1 = this;
  local_308 = __return_storage_ptr__;
  local_300 = this;
  local_2f8 = &type;
  kj::
  runCatchingExceptions<capnp::compiler::Compiler::Node::resolveBootstrapType(capnp::schema::Type::Reader,capnp::Schema)::__0>
            (&local_2e8,(kj *)&local_308,func);
  other = kj::_::readMaybe<kj::Exception>(&local_2e8);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_188,other);
  kj::Maybe<kj::Exception>::~Maybe(&local_2e8);
  pEVar2 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_188);
  if (pEVar2 != (Exception *)0x0) {
    kj::Maybe<capnp::Type>::operator=(__return_storage_ptr__,(void *)0x0);
    pEVar3 = CompiledModule::getErrorReporter(this->module);
    uVar1 = (*pEVar3->_vptr_ErrorReporter[1])();
    if ((uVar1 & 1) == 0) {
      pEVar2 = kj::_::NullableValue<kj::Exception>::operator*
                         ((NullableValue<kj::Exception> *)local_188);
      kj::str<char_const(&)[57],kj::Exception&>
                (&local_340,(kj *)"Internal compiler bug: Bootstrap schema failed to load:\n",
                 (char (*) [57])pEVar2,(Exception *)params_1);
      kj::StringPtr::StringPtr((StringPtr *)local_328,&local_340);
      addError(this,(StringPtr)local_328[0]);
      kj::String::~String(&local_340);
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_188);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::Node::resolveBootstrapType(schema::Type::Reader type, Schema scope) {
  // TODO(someday): Arguably should return null if the type or its dependencies are placeholders.

  kj::Maybe<Type> result;
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&]() {
    result = module->getCompiler().getWorkspace().bootstrapLoader.getType(type, scope);
  })) {
    result = nullptr;
    if (!module->getErrorReporter().hadErrors()) {
      addError(kj::str("Internal compiler bug: Bootstrap schema failed to load:\n",
                       *exception));
    }
  }
  return result;
}